

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  int *piVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  float *pfVar13;
  uint uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 in_EAX;
  int i;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  ulong uVar29;
  int iVar30;
  void *pvVar31;
  void *pvVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  int k;
  ulong uVar36;
  bool bVar37;
  undefined4 uVar38;
  float fVar39;
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  int local_158;
  allocator_type local_151;
  void *local_150;
  ulong local_148;
  Mat *local_140;
  long local_138;
  ulong local_130;
  ulong local_128;
  long local_120;
  int local_114;
  int local_110;
  int local_10c;
  Mat local_108;
  long local_b8;
  Mat *local_b0;
  undefined1 local_a8 [16];
  Option *local_90;
  void *local_88;
  void *local_80;
  ulong local_78;
  long local_70;
  size_t local_68;
  void *local_60;
  ulong local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  iVar28 = bottom_blob->w;
  iVar22 = bottom_blob->h;
  iVar2 = this->kernel_w;
  iVar3 = this->dilation_w;
  sVar7 = bottom_blob->elemsize;
  iVar4 = this->stride_w;
  iVar5 = this->kernel_h;
  iVar21 = this->dilation_h;
  iVar25 = this->stride_h;
  iVar30 = this->output_pad_right;
  iVar26 = this->output_pad_bottom;
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  auVar40._0_4_ = -(uint)(0 < this->pad_left);
  auVar40._4_4_ = -(uint)(0 < this->pad_right);
  auVar40._8_4_ = -(uint)(0 < this->pad_top);
  auVar40._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar19 = movmskps(in_EAX,auVar40);
  lVar33 = 0x10;
  if ((iVar19 == 0) &&
     (((this->output_w < 1 || (this->output_h < 1)) && (lVar33 = 8, &local_108 != top_blob)))) {
    piVar8 = top_blob->refcount;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    local_108.data = top_blob->data;
    local_108.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_108.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_108.elemsize = top_blob->elemsize;
    local_108.elempack = top_blob->elempack;
    local_108.allocator = top_blob->allocator;
    uVar15 = top_blob->dims;
    uVar16 = top_blob->w;
    uVar17 = top_blob->h;
    uVar18 = top_blob->d;
    local_108.c = top_blob->c;
    local_108.cstep = top_blob->cstep;
    local_108.dims = uVar15;
    local_108.w = uVar16;
    local_108.h = uVar17;
    local_108.d = uVar18;
  }
  local_140 = top_blob;
  local_b0 = bottom_blob;
  local_90 = opt;
  Mat::create(&local_108,iVar30 + (iVar2 + -1) * iVar3 + (iVar28 + -1) * iVar4 + 1,
              iVar26 + 1 + (iVar5 + -1) * iVar21 + (iVar22 + -1) * iVar25,this->num_output,sVar7,
              *(Allocator **)(&opt->lightmode + lVar33));
  iVar22 = local_108.w;
  iVar28 = -100;
  if ((local_108.data != (void *)0x0) &&
     (local_128 = (ulong)local_108.c, local_108.cstep * local_128 != 0)) {
    iVar28 = this->kernel_w;
    iVar2 = this->kernel_h;
    local_138 = (long)this->stride_w;
    local_120 = (long)this->stride_h;
    iVar3 = this->dilation_w;
    iVar4 = this->dilation_h;
    local_148 = (ulong)(uint)this->activation_type;
    uVar20 = iVar2 * iVar28;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(long)(int)uVar20,&local_151);
    iVar21 = 0;
    iVar5 = iVar28;
    if (iVar28 < 1) {
      iVar5 = iVar21;
    }
    if (iVar2 < 1) {
      iVar2 = iVar21;
    }
    iVar26 = 0;
    iVar30 = 0;
    iVar25 = iVar5;
    for (; iVar21 != iVar2; iVar21 = iVar21 + 1) {
      for (lVar33 = (long)iVar30; iVar25 != lVar33; lVar33 = lVar33 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar33] = iVar26;
        iVar26 = iVar26 + iVar3;
      }
      iVar26 = iVar26 + (iVar22 * iVar4 - iVar3 * iVar28);
      iVar25 = iVar25 + iVar5;
      iVar30 = iVar30 + iVar5;
    }
    local_10c = local_108.d;
    local_b8 = local_108.cstep * local_108.elemsize;
    local_70 = (long)local_108.h * (long)local_108.w;
    local_78 = local_108.elemsize * local_70 + 0xf & 0xfffffffffffffff0;
    local_88 = (this->bias_data).data;
    bVar37 = local_88 != (void *)0x0;
    iVar28 = (this->bias_data).c;
    sVar7 = (this->bias_data).cstep;
    uVar6 = local_b0->c;
    uVar35 = 0;
    if (0 < (int)uVar20) {
      uVar35 = (ulong)uVar20;
    }
    uVar29 = 0;
    if (0 < (int)uVar6) {
      uVar29 = (ulong)uVar6;
    }
    uVar14 = local_b0->w;
    if (local_b0->w < 1) {
      uVar14 = 0;
    }
    local_130 = (ulong)uVar14;
    local_58 = (ulong)(uint)local_b0->h;
    if (local_b0->h < 1) {
      local_58 = 0;
    }
    uVar14 = local_108.h * local_108.w;
    if (local_108.h * local_108.w < 1) {
      uVar14 = 0;
    }
    local_50 = (ulong)uVar14;
    iVar22 = (int)local_128;
    local_128 = local_128 & 0xffffffff;
    if (iVar22 < 1) {
      local_128 = 0;
    }
    local_68 = local_108.elemsize;
    local_120 = local_120 * local_108.w * local_108.elemsize;
    local_110 = uVar6 * uVar20;
    local_148 = (ulong)((int)local_148 - 1);
    local_114 = local_108.dims;
    local_158 = 0;
    local_80 = local_108.data;
    pvVar31 = local_108.data;
    for (uVar24 = 0; uVar24 != local_128; uVar24 = uVar24 + 1) {
      iVar22 = (int)(local_78 / local_68);
      if (local_114 == 4) {
        iVar22 = (int)local_70;
      }
      uVar38 = 0;
      if ((long)iVar28 * sVar7 != 0 && bVar37) {
        uVar38 = *(undefined4 *)((long)local_88 + uVar24 * 4);
      }
      local_a8._0_8_ = (long)local_158 * 4;
      local_60 = (void *)(local_b8 * uVar24 + (long)local_80);
      iVar22 = iVar22 * local_10c;
      if (iVar22 < 1) {
        iVar22 = 0;
      }
      for (lVar33 = 0; iVar22 != (int)lVar33; lVar33 = lVar33 + 1) {
        *(undefined4 *)((long)pvVar31 + lVar33 * 4) = uVar38;
      }
      for (uVar23 = 0; uVar23 != local_58; uVar23 = uVar23 + 1) {
        pvVar9 = (this->weight_data).data;
        for (uVar34 = 0; uVar34 != local_130; uVar34 = uVar34 + 1) {
          lVar33 = uVar34 * local_138 * 4 + local_120 * uVar23;
          iVar22 = local_b0->w;
          sVar10 = local_b0->elemsize;
          sVar11 = local_b0->cstep;
          pvVar12 = local_b0->data;
          pvVar32 = (void *)((long)pvVar9 + (long)local_158 * 4);
          for (uVar27 = 0; uVar27 != uVar29; uVar27 = uVar27 + 1) {
            fVar39 = *(float *)((long)pvVar12 +
                               sVar11 * sVar10 * uVar27 +
                               uVar34 * 4 + (long)iVar22 * uVar23 * sVar10);
            for (uVar36 = 0; uVar35 != uVar36; uVar36 = uVar36 + 1) {
              *(float *)((long)local_60 +
                        (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar36] * 4 + lVar33) =
                   *(float *)((long)pvVar32 + uVar36 * 4) * fVar39 +
                   *(float *)((long)local_60 +
                             (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar36] * 4 + lVar33);
            }
            pvVar32 = (void *)((long)pvVar32 + (long)(int)uVar20 * 4);
          }
        }
      }
      pfVar13 = (float *)(this->activation_params).data;
      uVar23 = local_148;
      local_150 = pvVar31;
      for (uVar34 = 0; local_50 != uVar34; uVar34 = uVar34 + 1) {
        fVar39 = *(float *)((long)pvVar31 + uVar34 * 4);
        fVar42 = fVar39;
        if ((uint)uVar23 < 6) {
          switch((long)&switchD_002760d6::switchdataD_004c3d80 +
                 (long)(int)(&switchD_002760d6::switchdataD_004c3d80)[uVar23]) {
          case 0x2760d8:
            if (fVar39 <= 0.0) {
              fVar42 = 0.0;
            }
            break;
          case 0x2760e8:
            local_a8 = ZEXT416((uint)fVar39);
            fVar39 = expf(fVar39);
            fVar39 = logf(fVar39 + 1.0);
            fVar39 = tanhf(fVar39);
            uVar23 = local_148;
            pvVar31 = local_150;
            fVar42 = fVar39 * (float)local_a8._0_4_;
            break;
          case 0x276127:
            if (fVar39 <= *pfVar13) {
              fVar39 = *pfVar13;
            }
            fVar42 = pfVar13[1];
            if (fVar39 <= pfVar13[1]) {
              fVar42 = fVar39;
            }
            break;
          case 0x276148:
            if (88.37626 <= fVar39) {
              fVar39 = 88.37626;
            }
            fVar39 = expf((float)(-(uint)(fVar39 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar39 < -88.37626) & (uint)-fVar39));
            uVar23 = local_148;
            pvVar31 = local_150;
            fVar42 = 1.0 / (fVar39 + 1.0);
            break;
          case 0x27619f:
            fVar42 = (float)(~-(uint)(0.0 < fVar39) & (uint)*pfVar13 |
                            -(uint)(0.0 < fVar39) & 0x3f800000) * fVar39;
            break;
          case 0x2761cc:
            fVar1 = *pfVar13;
            fVar41 = -pfVar13[1] / fVar1;
            fVar42 = 0.0;
            if ((fVar41 <= fVar39) && (fVar42 = fVar39, fVar39 <= fVar41 + 1.0 / fVar1)) {
              fVar42 = (fVar1 * fVar39 + pfVar13[1]) * fVar39;
            }
          }
        }
        *(float *)((long)pvVar31 + uVar34 * 4) = fVar42;
      }
      pvVar31 = (void *)((long)pvVar31 + local_b8);
      local_158 = local_158 + local_110;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    cut_padding(this,&local_108,local_140,local_90);
    if ((local_140->data == (void *)0x0) || (iVar28 = 0, (long)local_140->c * local_140->cstep == 0)
       ) {
      iVar28 = -100;
    }
  }
  piVar8 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        free(local_108.data);
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar28;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}